

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::DualizeBackInteriorSolution
          (Model *this,Vector *x_solver,Vector *xl_solver,Vector *xu_solver,Vector *y_solver,
          Vector *zl_solver,Vector *zu_solver,Vector *x_user,Vector *xl_user,Vector *xu_user,
          Vector *slack_user,Vector *y_user,Vector *zl_user,Vector *zu_user)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  double *pdVar7;
  double *pdVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  _Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> local_38;
  
  uVar2 = this->num_rows_;
  lVar13 = (long)this->num_cols_;
  if (this->dualized_ == true) {
    local_38._M_closure.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnClos<std::__negate,_std::_ValArray,_double>)
         (_UnClos<std::__negate,_std::_ValArray,_double>)y_solver;
    std::valarray<double>::operator=(x_user,&local_38);
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = xl_solver->_M_data;
    pdVar8 = y_user->_M_data;
    pdVar4 = xu_solver->_M_data;
    pdVar5 = x_solver->_M_data;
    uVar12 = 0;
    uVar11 = (ulong)(uint)this->num_constr_;
    if (this->num_constr_ < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      cVar1 = pcVar3[uVar12];
      if (cVar1 == '<') {
        dVar14 = -pdVar4[uVar12];
LAB_00388a7a:
        pdVar8[uVar12] = dVar14;
      }
      else {
        if (cVar1 == '>') {
          dVar14 = pdVar7[uVar12];
          goto LAB_00388a7a;
        }
        if (cVar1 == '=') {
          dVar14 = pdVar5[uVar12];
          goto LAB_00388a7a;
        }
      }
    }
    uVar10 = this->num_var_;
    if (0 < (long)(int)uVar10) {
      pdVar7 = (double *)zl_user->_M_size;
      if (pdVar7 != (double *)0x0) {
        pdVar7 = zl_user->_M_data;
      }
      pdVar8 = (double *)xl_solver->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = xl_solver->_M_data;
      }
      memmove(pdVar7,pdVar8 + lVar13,(long)(int)uVar10 << 3);
      uVar10 = this->num_var_;
    }
    pdVar7 = (this->scaled_lbuser_)._M_data;
    pdVar8 = zl_user->_M_data;
    uVar12 = 0;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS(pdVar7[uVar12])) {
        pdVar8[uVar12] = 0.0;
      }
    }
    local_38._M_closure.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnClos<std::__negate,_std::_ValArray,_double>)
         (_UnBase<std::__negate,_std::valarray<double>_>)0x0;
    std::valarray<double>::operator=(zu_user,(double *)&local_38);
    piVar6 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = zu_user->_M_data;
    pdVar8 = xl_solver->_M_data + this->num_constr_;
    for (piVar9 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar6; piVar9 = piVar9 + 1) {
      pdVar7[*piVar9] = *pdVar8;
      pdVar8 = pdVar8 + 1;
    }
    pdVar7 = (this->scaled_lbuser_)._M_data;
    pdVar8 = xl_user->_M_data;
    uVar12 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar12;
    }
    pdVar4 = zl_solver->_M_data;
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      dVar14 = INFINITY;
      if ((ulong)ABS(pdVar7[uVar12]) < 0x7ff0000000000000) {
        dVar14 = pdVar4[lVar13 + uVar12];
      }
      pdVar8[uVar12] = dVar14;
    }
    local_38._M_closure.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnClos<std::__negate,_std::_ValArray,_double>)
         (_UnBase<std::__negate,_std::valarray<double>_>)0x7ff0000000000000;
    std::valarray<double>::operator=(xu_user,(double *)&local_38);
    uVar2 = this->num_constr_;
    piVar6 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = xu_user->_M_data;
    pdVar8 = zl_solver->_M_data + (int)uVar2;
    for (piVar9 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar6; piVar9 = piVar9 + 1) {
      pdVar7[*piVar9] = *pdVar8;
      pdVar8 = pdVar8 + 1;
    }
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = zl_solver->_M_data;
    pdVar8 = slack_user->_M_data;
    pdVar4 = zu_solver->_M_data;
    uVar11 = 0;
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      cVar1 = pcVar3[uVar11];
      if (cVar1 == '>') {
        dVar14 = -pdVar7[uVar11];
LAB_00388e31:
        pdVar8[uVar11] = dVar14;
      }
      else {
        if (cVar1 == '=') {
          dVar14 = 0.0;
          goto LAB_00388e31;
        }
        if (cVar1 == '<') {
          dVar14 = pdVar4[uVar11];
          goto LAB_00388e31;
        }
      }
    }
  }
  else {
    if (0 < (long)this->num_var_) {
      pdVar7 = (double *)x_user->_M_size;
      if (pdVar7 != (double *)0x0) {
        pdVar7 = x_user->_M_data;
      }
      pdVar8 = (double *)x_solver->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = x_solver->_M_data;
      }
      memmove(pdVar7,pdVar8,(long)this->num_var_ << 3);
    }
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = y_user->_M_data;
    pdVar8 = y_solver->_M_data;
    uVar12 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar12;
    }
    pdVar4 = zu_solver->_M_data;
    pdVar5 = zl_solver->_M_data;
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      cVar1 = pcVar3[uVar12];
      if (cVar1 == '<') {
        dVar14 = -pdVar5[lVar13 + uVar12];
LAB_00388b3b:
        pdVar7[uVar12] = dVar14;
      }
      else {
        if (cVar1 == '>') {
          dVar14 = pdVar4[lVar13 + uVar12];
          goto LAB_00388b3b;
        }
        if (cVar1 == '=') {
          dVar14 = pdVar8[uVar12];
          goto LAB_00388b3b;
        }
      }
    }
    if (0 < (long)this->num_var_) {
      pdVar7 = (double *)zl_user->_M_size;
      if (pdVar7 != (double *)0x0) {
        pdVar7 = zl_user->_M_data;
      }
      pdVar8 = (double *)zl_solver->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = zl_solver->_M_data;
      }
      memmove(pdVar7,pdVar8,(long)this->num_var_ << 3);
      if (0 < (long)this->num_var_) {
        pdVar7 = (double *)zu_user->_M_size;
        if (pdVar7 != (double *)0x0) {
          pdVar7 = zu_user->_M_data;
        }
        pdVar8 = (double *)zu_solver->_M_size;
        if (pdVar8 != (double *)0x0) {
          pdVar8 = zu_solver->_M_data;
        }
        memmove(pdVar7,pdVar8,(long)this->num_var_ << 3);
        if (0 < (long)this->num_var_) {
          pdVar7 = (double *)xl_user->_M_size;
          if (pdVar7 != (double *)0x0) {
            pdVar7 = xl_user->_M_data;
          }
          pdVar8 = (double *)xl_solver->_M_size;
          if (pdVar8 != (double *)0x0) {
            pdVar8 = xl_solver->_M_data;
          }
          memmove(pdVar7,pdVar8,(long)this->num_var_ << 3);
          if (0 < (long)this->num_var_) {
            pdVar7 = (double *)xu_user->_M_size;
            if (pdVar7 != (double *)0x0) {
              pdVar7 = xu_user->_M_data;
            }
            pdVar8 = (double *)xu_solver->_M_size;
            if (pdVar8 != (double *)0x0) {
              pdVar8 = xu_solver->_M_data;
            }
            memmove(pdVar7,pdVar8,(long)this->num_var_ << 3);
          }
        }
      }
    }
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = slack_user->_M_data;
    pdVar8 = xu_solver->_M_data;
    pdVar4 = xl_solver->_M_data;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      cVar1 = pcVar3[uVar12];
      if (cVar1 == '>') {
        dVar14 = -pdVar8[lVar13 + uVar12];
LAB_00388e99:
        pdVar7[uVar12] = dVar14;
      }
      else {
        if (cVar1 == '=') {
          dVar14 = 0.0;
          goto LAB_00388e99;
        }
        if (cVar1 == '<') {
          dVar14 = pdVar4[lVar13 + uVar12];
          goto LAB_00388e99;
        }
      }
    }
  }
  return;
}

Assistant:

void Model::DualizeBackInteriorSolution(const Vector& x_solver,
                                        const Vector& xl_solver,
                                        const Vector& xu_solver,
                                        const Vector& y_solver,
                                        const Vector& zl_solver,
                                        const Vector& zu_solver,
                                        Vector& x_user,
                                        Vector& xl_user,
                                        Vector& xu_user,
                                        Vector& slack_user,
                                        Vector& y_user,
                                        Vector& zl_user,
                                        Vector& zu_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;

        // If the solution from the solver would be exact, we could copy the
        // first num_constr_ entries from x_solver into y_user. However, to
        // satisfy the sign condition on y_user even if the solution is not
        // exact, we have to use the xl_solver and xu_solver entries for
        // inequality constraints.
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = x_solver[i];
                break;
            case '<':
                y_user[i] = -xu_solver[i];
                break;
            case '>':
                y_user[i] = xl_solver[i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }

        // Dual variables associated with lbuser <= x in the scaled user model
        // are the slack variables from the solver. For an exact solution we
        // would have x_solver[n+1:n+m] == xl_solver[n+1:n+m]. Using xl_solver
        // guarantees that zl_user >= 0 in any case. If variable j has no lower
        // bound in the scaled user model (i.e. is free), then the j-th slack
        // variable was fixed at zero in the solver model, but the IPM solution
        // may not satisfy this. Hence we must set zl_user[j] = 0 explicitly.
        std::copy_n(std::begin(xl_solver) + n, num_var_, std::begin(zl_user));
        for (Int j = 0; j < num_var_; j++)
            if (!std::isfinite(scaled_lbuser_[j]))
                zl_user[j] = 0.0;

        // Dual variables associated with x <= ubuser in the scaled user model
        // are the primal variables that were added for boxed variables in the
        // solver model.
        zu_user = 0.0;
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            zu_user[j] = xl_solver[k++];
        assert(k == n);

        // xl in the scaled user model is zl[n+1:n+m] in the solver model or
        // infinity.
        for (Int i = 0; i < m; i++) {
            if (std::isfinite(scaled_lbuser_[i]))
                xl_user[i] = zl_solver[n+i];
            else
                xl_user[i] = INFINITY;
        }

        // xu in the scaled user model are the entries in zl for columns of the
        // negative identity matrix (that were added for boxed variables).
        xu_user = INFINITY;
        k = num_constr_;
        for (Int j : boxed_vars_)
            xu_user[j] = zl_solver[k++];
        assert(k == n);
        
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = zu_solver[i];
                break;
            case '>':
                slack_user[i] = -zl_solver[i];
                break;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));

        // Instead of copying y_solver into y_user, we use the entries from
        // zl_solver and zu_solver for inequality constraints, so that the sign
        // condition on y_user is satisfied.
        for (Int i = 0; i < m; i++) {
            assert(lb_[n+i] == 0.0 || lb_[n+i] == -INFINITY);
            assert(ub_[n+i] == 0.0 || ub_[n+i] ==  INFINITY);
            assert(lb_[n+i] == 0.0 || ub_[n+i] == 0.0);
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = y_solver[i];
                break;
            case '<':
                y_user[i] = -zl_solver[n+i];
                break;
            case '>':
                y_user[i] = zu_solver[n+i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }
        std::copy_n(std::begin(zl_solver), num_var_, std::begin(zl_user));
        std::copy_n(std::begin(zu_solver), num_var_, std::begin(zu_user));
        std::copy_n(std::begin(xl_solver), num_var_, std::begin(xl_user));
        std::copy_n(std::begin(xu_solver), num_var_, std::begin(xu_user));

        // If the solution would be exact, slack_user were given by the entries
        // of x_solver corresponding to slack columns. To satisfy the sign
        // condition in any case, we build the slack for inequality constraints
        // from xl_solver and xu_solver and set the slack for equality
        // constraints to zero.
        for (Int i = 0; i < m; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = xl_solver[n+i];
                break;
            case '>':
                slack_user[i] = -xu_solver[n+i];
                break;
            }
            assert(std::isfinite(slack_user[i]));
        }
    }
}